

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase_real.hpp
# Opt level: O0

void soplex::
     MPSreadRanges<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
               (MPSInput *mps,
               LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *rset,NameSet *rnames,SPxOut *spxout)

{
  bool bVar1;
  type_conflict5 tVar2;
  Verbosity VVar3;
  int iVar4;
  char *pcVar5;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar6;
  ulong *puVar7;
  SPxOut *in_RCX;
  cpp_dec_float<50U,_int,_void> *in_RDX;
  MPSInput *in_RDI;
  Verbosity old_verbosity;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  val;
  int idx;
  char rngname [256];
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_3;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_3;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_1;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_2;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_2;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  undefined4 in_stack_fffffffffffff748;
  int in_stack_fffffffffffff74c;
  MPSInput *in_stack_fffffffffffff750;
  NameSet *in_stack_fffffffffffff758;
  cpp_dec_float<50U,_int,_void> *in_stack_fffffffffffff760;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff768;
  MPSInput *in_stack_fffffffffffff770;
  type_conflict5 local_881;
  type_conflict5 local_839;
  char *in_stack_fffffffffffff7d0;
  cpp_dec_float<50U,_int,_void> *this;
  MPSInput *in_stack_fffffffffffff7e8;
  undefined1 local_810 [48];
  undefined1 local_7a0 [56];
  undefined1 local_768 [56];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_730;
  undefined1 local_6f8 [56];
  ulong local_6c0;
  undefined1 local_6b4 [56];
  undefined4 local_67c;
  undefined1 local_678 [56];
  ulong local_640;
  undefined1 local_638 [56];
  double local_600;
  undefined1 local_5f8 [56];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_5c0;
  undefined1 local_588 [56];
  undefined1 local_550 [56];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_518;
  undefined1 local_4e0 [56];
  ulong local_4a8;
  undefined1 local_49c [56];
  undefined4 local_464;
  char local_460 [56];
  ulong local_428;
  char local_420 [56];
  double local_3e8;
  undefined4 local_3dc;
  Verbosity local_3d8;
  undefined1 local_3d4 [56];
  int local_39c;
  undefined1 local_398 [264];
  cpp_dec_float<50U,_int,_void> *local_290;
  MPSInput *local_280;
  undefined8 local_278;
  ulong *local_270;
  char *local_268;
  char *local_260;
  char *local_258;
  char *local_250;
  char *local_248;
  ulong *local_240;
  undefined1 *local_238;
  char local_230 [8];
  ulong *local_228;
  undefined1 *local_220;
  char local_218 [16];
  undefined1 *local_208;
  char local_200 [8];
  ulong *local_1f8;
  undefined1 *local_1f0;
  undefined1 *local_1e8;
  undefined1 *local_1e0;
  undefined1 *local_1d8;
  undefined1 *local_1d0;
  undefined1 *local_1c8;
  undefined1 *local_1c0;
  undefined1 *local_1b8;
  undefined1 *local_1b0;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_198;
  undefined1 *local_190;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_188;
  undefined1 *local_180;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_178;
  undefined1 *local_170;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_168;
  ulong *local_160;
  char local_158 [8];
  ulong *local_150;
  ulong *local_148;
  char *local_140;
  ulong *local_138;
  double *local_130;
  undefined1 *local_128;
  double *local_120;
  double *local_118;
  undefined1 *local_110;
  double *local_108;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_f9;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_f8;
  MPSInput *local_f0;
  undefined1 *local_e8;
  undefined1 *local_e0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_d8;
  MPSInput *local_d0;
  undefined1 *local_c8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_b9;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_b8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_b0;
  undefined1 *local_a8;
  undefined1 *local_a0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_98;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_90;
  undefined1 *local_88;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_79;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_78;
  NameSet *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_58;
  NameSet *local_50;
  undefined1 *local_48;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_39;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_38;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_18;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_10;
  undefined1 *local_8;
  
  local_398._256_8_ = in_RCX;
  local_290 = in_RDX;
  local_280 = in_RDI;
  memset(local_398,0,0x100);
  local_1e8 = local_3d4;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
            ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff750);
  do {
    bVar1 = MPSInput::readLine(in_stack_fffffffffffff7e8);
    if (!bVar1) {
LAB_001b889c:
      MPSInput::syntaxError(in_stack_fffffffffffff750);
      return;
    }
    pcVar5 = MPSInput::field0(local_280);
    if (pcVar5 != (char *)0x0) {
      if (((SPxOut *)local_398._256_8_ != (SPxOut *)0x0) &&
         (VVar3 = SPxOut::getVerbosity((SPxOut *)local_398._256_8_), 3 < (int)VVar3)) {
        local_3d8 = SPxOut::getVerbosity((SPxOut *)local_398._256_8_);
        local_3dc = 4;
        (*(*(_func_int ***)local_398._256_8_)[2])(local_398._256_8_,&local_3dc);
        operator<<((SPxOut *)in_stack_fffffffffffff750,
                   (char *)CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748));
        operator<<((SPxOut *)in_stack_fffffffffffff750,
                   (char *)CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748));
        operator<<((SPxOut *)in_stack_fffffffffffff750,
                   (_func_ostream_ptr_ostream_ptr *)
                   CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748));
        (*(*(_func_int ***)local_398._256_8_)[2])(local_398._256_8_,&local_3d8);
      }
      pcVar5 = MPSInput::field0(local_280);
      iVar4 = strcmp(pcVar5,"BOUNDS");
      if (iVar4 == 0) {
        MPSInput::setSection(local_280,BOUNDS);
        return;
      }
      pcVar5 = MPSInput::field0(local_280);
      iVar4 = strcmp(pcVar5,"ENDATA");
      if (iVar4 == 0) {
        MPSInput::setSection(local_280,ENDATA);
        return;
      }
      goto LAB_001b889c;
    }
    pcVar5 = MPSInput::field2(local_280);
    if (((pcVar5 != (char *)0x0) && (pcVar5 = MPSInput::field3(local_280), pcVar5 == (char *)0x0))
       || ((pcVar5 = MPSInput::field4(local_280), pcVar5 != (char *)0x0 &&
           (pcVar5 = MPSInput::field5(local_280), pcVar5 == (char *)0x0)))) {
      MPSInput::insertName(local_280,"_RNG_",false);
    }
    pcVar5 = MPSInput::field1(local_280);
    if (((pcVar5 == (char *)0x0) || (pcVar5 = MPSInput::field2(local_280), pcVar5 == (char *)0x0))
       || (pcVar5 = MPSInput::field3(local_280), pcVar5 == (char *)0x0)) goto LAB_001b889c;
    if (local_398[0] == '\0') {
      in_stack_fffffffffffff7e8 = (MPSInput *)local_398;
      pcVar5 = MPSInput::field1(local_280);
      spxSnprintf((char *)in_stack_fffffffffffff7e8,0x100,"%s",pcVar5);
    }
    pcVar5 = MPSInput::field1(local_280);
    iVar4 = strcmp(local_398,pcVar5);
    if (iVar4 == 0) {
      this = local_290;
      MPSInput::field2(local_280);
      local_39c = NameSet::number(in_stack_fffffffffffff758,(char *)in_stack_fffffffffffff750);
      if (local_39c < 0) {
        in_stack_fffffffffffff7d0 = MPSInput::field1(local_280);
        MPSInput::field2(local_280);
        MPSInput::entryIgnored
                  (in_stack_fffffffffffff770,(char *)in_stack_fffffffffffff768,
                   (char *)in_stack_fffffffffffff760,(char *)in_stack_fffffffffffff758,
                   (char *)in_stack_fffffffffffff750);
      }
      else {
        pcVar5 = MPSInput::field3(local_280);
        local_3e8 = atof(pcVar5);
        local_110 = local_3d4;
        local_118 = &local_3e8;
        local_108 = local_118;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  (this,(double)in_stack_fffffffffffff7d0);
        LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::lhs((LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)in_stack_fffffffffffff750,in_stack_fffffffffffff74c);
        puVar7 = (ulong *)infinity();
        local_428 = *puVar7 ^ 0x8000000000000000;
        local_268 = local_420;
        local_270 = &local_428;
        local_278._0_1_ = '\0';
        local_278._1_7_ = 0;
        local_138 = local_270;
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                  (in_stack_fffffffffffff760,(double)in_stack_fffffffffffff758,
                   in_stack_fffffffffffff750);
        tVar2 = boost::multiprecision::operator>
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748),
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)0x1b7dda);
        local_839 = false;
        if (tVar2) {
          LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::rhs_w((LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)in_stack_fffffffffffff750,in_stack_fffffffffffff74c);
          local_258 = (char *)infinity();
          local_250 = local_460;
          local_260 = (char *)0x0;
          local_140 = local_258;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                    (in_stack_fffffffffffff760,(double)in_stack_fffffffffffff758,
                     in_stack_fffffffffffff750);
          local_839 = boost::multiprecision::operator<
                                ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748),
                                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)0x1b7e6d);
        }
        if (local_839 == false) {
          LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::lhs((LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *)in_stack_fffffffffffff750,in_stack_fffffffffffff74c);
          puVar7 = (ulong *)infinity();
          local_4a8 = *puVar7 ^ 0x8000000000000000;
          local_238 = local_49c;
          local_240 = &local_4a8;
          local_248 = (char *)0x0;
          local_148 = local_240;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                    (in_stack_fffffffffffff760,(double)in_stack_fffffffffffff758,
                     in_stack_fffffffffffff750);
          tVar2 = boost::multiprecision::operator>
                            ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748),
                             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)0x1b7f9d);
          if (tVar2) {
            pnVar6 = LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ::lhs((LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            *)in_stack_fffffffffffff750,in_stack_fffffffffffff74c);
            local_1d8 = local_550;
            local_1e0 = local_3d4;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                      ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff750,
                       (cpp_dec_float<50U,_int,_void> *)
                       CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748));
            spxAbs<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748));
            local_28 = local_4e0;
            local_38 = &local_518;
            local_30 = pnVar6;
            boost::multiprecision::detail::
            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
            ::
            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (&local_39,pnVar6,local_38);
            local_20 = local_4e0;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                      ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff750);
            local_8 = local_4e0;
            local_10 = local_30;
            local_18 = local_38;
            boost::multiprecision::default_ops::
            eval_add<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff750,
                       (cpp_dec_float<50U,_int,_void> *)
                       CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748),
                       (cpp_dec_float<50U,_int,_void> *)0x1b80bd);
            local_168 = LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ::rhs_w((LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 *)in_stack_fffffffffffff750,in_stack_fffffffffffff74c);
            local_170 = local_4e0;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                      ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff750,
                       (cpp_dec_float<50U,_int,_void> *)
                       CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748));
          }
          else {
            pnVar6 = LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ::rhs((LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            *)in_stack_fffffffffffff750,in_stack_fffffffffffff74c);
            local_1c8 = local_5f8;
            local_1d0 = local_3d4;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                      ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff750,
                       (cpp_dec_float<50U,_int,_void> *)
                       CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748));
            spxAbs<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748));
            local_a8 = local_588;
            local_b8 = &local_5c0;
            local_b0 = pnVar6;
            boost::multiprecision::detail::
            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
            ::
            scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                      (&local_b9,pnVar6,local_b8);
            local_a0 = local_588;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                      ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff750);
            local_88 = local_588;
            local_90 = local_b0;
            local_98 = local_b8;
            boost::multiprecision::default_ops::
            eval_subtract<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                      ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff750,
                       (cpp_dec_float<50U,_int,_void> *)
                       CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748),
                       (cpp_dec_float<50U,_int,_void> *)0x1b821a);
            local_178 = LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        ::lhs_w((LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 *)in_stack_fffffffffffff750,in_stack_fffffffffffff74c);
            local_180 = local_588;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                      ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff750,
                       (cpp_dec_float<50U,_int,_void> *)
                       CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748));
          }
        }
        else {
          local_464 = 0;
          tVar2 = boost::multiprecision::operator>=
                            ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)in_stack_fffffffffffff758,(int *)in_stack_fffffffffffff750);
          if (tVar2) {
            LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::rhs_w((LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)in_stack_fffffffffffff750,in_stack_fffffffffffff74c);
            boost::multiprecision::
            number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            ::operator+=((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)in_stack_fffffffffffff770,in_stack_fffffffffffff768);
          }
          else {
            LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::lhs_w((LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)in_stack_fffffffffffff750,in_stack_fffffffffffff74c);
            boost::multiprecision::
            number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            ::operator+=((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)in_stack_fffffffffffff770,in_stack_fffffffffffff768);
          }
        }
      }
      pcVar5 = MPSInput::field5(local_280);
      if (pcVar5 != (char *)0x0) {
        MPSInput::field4(local_280);
        local_39c = NameSet::number(in_stack_fffffffffffff758,(char *)in_stack_fffffffffffff750);
        if (local_39c < 0) {
          MPSInput::field1(local_280);
          MPSInput::field4(local_280);
          MPSInput::entryIgnored
                    (in_stack_fffffffffffff770,(char *)in_stack_fffffffffffff768,
                     (char *)in_stack_fffffffffffff760,(char *)in_stack_fffffffffffff758,
                     (char *)in_stack_fffffffffffff750);
        }
        else {
          pcVar5 = MPSInput::field5(local_280);
          local_600 = atof(pcVar5);
          local_128 = local_3d4;
          local_130 = &local_600;
          local_120 = local_130;
          boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                    (this,(double)in_stack_fffffffffffff7d0);
          in_stack_fffffffffffff770 =
               (MPSInput *)
               LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::lhs((LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)in_stack_fffffffffffff750,in_stack_fffffffffffff74c);
          puVar7 = (ulong *)infinity();
          local_640 = *puVar7 ^ 0x8000000000000000;
          local_220 = local_638;
          local_228 = &local_640;
          local_230[0] = '\0';
          local_230[1] = '\0';
          local_230[2] = '\0';
          local_230[3] = '\0';
          local_230[4] = '\0';
          local_230[5] = '\0';
          local_230[6] = '\0';
          local_230[7] = '\0';
          local_150 = local_228;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                    (in_stack_fffffffffffff760,(double)in_stack_fffffffffffff758,
                     in_stack_fffffffffffff750);
          tVar2 = boost::multiprecision::operator>
                            ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748),
                             (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)0x1b840e);
          local_881 = false;
          if (tVar2) {
            in_stack_fffffffffffff768 =
                 LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ::rhs((LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        *)in_stack_fffffffffffff750,in_stack_fffffffffffff74c);
            local_218._8_8_ = infinity();
            local_208 = local_678;
            local_218[0] = '\0';
            local_218[1] = '\0';
            local_218[2] = '\0';
            local_218[3] = '\0';
            local_218[4] = '\0';
            local_218[5] = '\0';
            local_218[6] = '\0';
            local_218[7] = '\0';
            local_158 = (char  [8])local_218._8_8_;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                      (in_stack_fffffffffffff760,(double)in_stack_fffffffffffff758,
                       in_stack_fffffffffffff750);
            local_881 = boost::multiprecision::operator<
                                  ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748),
                                   (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)0x1b84a1);
          }
          if (local_881 == false) {
            in_stack_fffffffffffff760 =
                 &LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::lhs((LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)in_stack_fffffffffffff750,in_stack_fffffffffffff74c)->m_backend;
            puVar7 = (ulong *)infinity();
            local_6c0 = *puVar7 ^ 0x8000000000000000;
            local_1f0 = local_6b4;
            local_1f8 = &local_6c0;
            local_200[0] = '\0';
            local_200[1] = '\0';
            local_200[2] = '\0';
            local_200[3] = '\0';
            local_200[4] = '\0';
            local_200[5] = '\0';
            local_200[6] = '\0';
            local_200[7] = '\0';
            local_160 = local_1f8;
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                      (in_stack_fffffffffffff760,(double)in_stack_fffffffffffff758,
                       in_stack_fffffffffffff750);
            tVar2 = boost::multiprecision::operator>
                              ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748),
                               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)0x1b85d1);
            if (tVar2) {
              in_stack_fffffffffffff758 =
                   (NameSet *)
                   LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ::lhs((LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          *)in_stack_fffffffffffff750,in_stack_fffffffffffff74c);
              local_1b8 = local_768;
              local_1c0 = local_3d4;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                        ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff750,
                         (cpp_dec_float<50U,_int,_void> *)
                         CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748));
              spxAbs<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748));
              local_68 = local_6f8;
              local_78 = &local_730;
              local_70 = in_stack_fffffffffffff758;
              boost::multiprecision::detail::
              scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
              ::
              scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_79,
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)in_stack_fffffffffffff758,local_78);
              local_60 = local_6f8;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                        ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff750);
              local_48 = local_6f8;
              local_50 = local_70;
              local_58 = local_78;
              boost::multiprecision::default_ops::
              eval_add<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                        ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff750,
                         (cpp_dec_float<50U,_int,_void> *)
                         CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748),
                         (cpp_dec_float<50U,_int,_void> *)0x1b86f1);
              local_188 = LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ::rhs_w((LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   *)in_stack_fffffffffffff750,in_stack_fffffffffffff74c);
              local_190 = local_6f8;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                        ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff750,
                         (cpp_dec_float<50U,_int,_void> *)
                         CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748));
            }
            else {
              in_stack_fffffffffffff750 =
                   (MPSInput *)
                   LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ::rhs((LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          *)in_stack_fffffffffffff750,in_stack_fffffffffffff74c);
              local_1a8 = local_810;
              local_1b0 = local_3d4;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                        ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff750,
                         (cpp_dec_float<50U,_int,_void> *)
                         CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748));
              spxAbs<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748));
              local_e8 = local_7a0;
              local_f8 = (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&stack0xfffffffffffff828;
              local_f0 = in_stack_fffffffffffff750;
              boost::multiprecision::detail::
              scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
              ::
              scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_f9,
                         (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)in_stack_fffffffffffff750,local_f8);
              local_e0 = local_7a0;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                        ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff750);
              local_c8 = local_7a0;
              local_d0 = local_f0;
              local_d8 = local_f8;
              boost::multiprecision::default_ops::
              eval_subtract<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                        ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff750,
                         (cpp_dec_float<50U,_int,_void> *)
                         CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748),
                         (cpp_dec_float<50U,_int,_void> *)0x1b884e);
              local_198 = LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ::lhs_w((LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   *)in_stack_fffffffffffff750,in_stack_fffffffffffff74c);
              local_1a0 = local_7a0;
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                        ((cpp_dec_float<50U,_int,_void> *)in_stack_fffffffffffff750,
                         (cpp_dec_float<50U,_int,_void> *)
                         CONCAT44(in_stack_fffffffffffff74c,in_stack_fffffffffffff748));
            }
          }
          else {
            local_67c = 0;
            tVar2 = boost::multiprecision::operator>=
                              ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)in_stack_fffffffffffff758,(int *)in_stack_fffffffffffff750);
            if (tVar2) {
              LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::rhs_w((LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)in_stack_fffffffffffff750,in_stack_fffffffffffff74c);
              boost::multiprecision::
              number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              ::operator+=((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)in_stack_fffffffffffff770,in_stack_fffffffffffff768);
            }
            else {
              LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::lhs_w((LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)in_stack_fffffffffffff750,in_stack_fffffffffffff74c);
              boost::multiprecision::
              number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
              ::operator+=((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)in_stack_fffffffffffff770,in_stack_fffffffffffff768);
            }
          }
        }
      }
    }
  } while( true );
}

Assistant:

static void MPSreadRanges(MPSInput& mps,  LPRowSetBase<R>& rset, const NameSet& rnames,
                          SPxOut* spxout)
{
   char rngname[MPSInput::MAX_LINE_LEN] = { '\0' };
   int idx;
   R val;

   while(mps.readLine())
   {
      if(mps.field0() != nullptr)
      {
         SPX_MSG_INFO2((*spxout), (*spxout) << "IMPSRD04 Range name     : " << rngname << std::endl;);

         if(!strcmp(mps.field0(), "BOUNDS"))
            mps.setSection(MPSInput::BOUNDS);
         else if(!strcmp(mps.field0(), "ENDATA"))
            mps.setSection(MPSInput::ENDATA);
         else
            break;

         return;
      }

      if(((mps.field2() != nullptr) && (mps.field3() == nullptr)) || ((mps.field4() != nullptr)
            && (mps.field5() == nullptr)))
         mps.insertName("_RNG_");

      if((mps.field1() == nullptr) || (mps.field2() == nullptr) || (mps.field3() == nullptr))
         break;

      if(*rngname == '\0')
      {
         assert(strlen(mps.field1()) < MPSInput::MAX_LINE_LEN);
         spxSnprintf(rngname, MPSInput::MAX_LINE_LEN, "%s", mps.field1());
      }

      /* The rules are:
       * Row Sign   LHS             RHS
       * ----------------------------------------
       *  G   +/-   rhs             rhs + |range|
       *  L   +/-   rhs - |range|   rhs
       *  E   +     rhs             rhs + range
       *  E   -     rhs + range     rhs
       * ----------------------------------------
       */
      if(!strcmp(rngname, mps.field1()))
      {
         if((idx = rnames.number(mps.field2())) < 0)
            mps.entryIgnored("Range", mps.field1(), "row", mps.field2());
         else
         {
            val = atof(mps.field3());

            // EQ
            if((rset.lhs(idx) > R(-infinity)) && (rset.rhs_w(idx) <  R(infinity)))
            {
               assert(rset.lhs(idx) == rset.rhs(idx));

               if(val >= 0)
                  rset.rhs_w(idx) += val;
               else
                  rset.lhs_w(idx) += val;
            }
            else
            {
               // GE
               if(rset.lhs(idx) > R(-infinity))
                  rset.rhs_w(idx)  = rset.lhs(idx) + spxAbs(val);
               // LE
               else
                  rset.lhs_w(idx)  = rset.rhs(idx) - spxAbs(val);
            }
         }

         if(mps.field5() != nullptr)
         {
            if((idx = rnames.number(mps.field4())) < 0)
               mps.entryIgnored("Range", mps.field1(), "row", mps.field4());
            else
            {
               val = atof(mps.field5());

               // EQ
               if((rset.lhs(idx) > R(-infinity)) && (rset.rhs(idx) <  R(infinity)))
               {
                  assert(rset.lhs(idx) == rset.rhs(idx));

                  if(val >= 0)
                     rset.rhs_w(idx) += val;
                  else
                     rset.lhs_w(idx) += val;
               }
               else
               {
                  // GE
                  if(rset.lhs(idx) > R(-infinity))
                     rset.rhs_w(idx)  = rset.lhs(idx) + spxAbs(val);
                  // LE
                  else
                     rset.lhs_w(idx)  = rset.rhs(idx) - spxAbs(val);
               }
            }
         }
      }
   }

   mps.syntaxError();
}